

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O3

dl_t dl_alloc(void)

{
  dl_t paVar1;
  
  paVar1 = (dl_t)malloc(0x18);
  if (paVar1 == (dl_t)0x0) {
    puts("Out of memory!!");
  }
  else {
    paVar1->first = (dl_el *)0x0;
    paVar1->last = (dl_el *)0x0;
    paVar1->count = 0;
  }
  return paVar1;
}

Assistant:

dl_t dl_alloc()
{
  dl_t dl = (dl_t)malloc(sizeof(dl_s));
  if (!dl) {
      printf("Out of memory!!\n");
  } else {
    dl->first = dl->last = 0; dl->count = 0;
  }
  return dl;
}